

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeIntBinary
          (GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val,Value **pDstVal,int32 min,
          int32 max,bool skipDst)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  int local_4c;
  Value **ppVStack_48;
  int32 intConstantValue;
  ulong local_40;
  Value *local_38;
  
  uVar6 = (ulong)(uint)min;
  local_38 = src1Val;
  bVar3 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (bVar3) {
    pIVar1 = *pInstr;
    ppVStack_48 = pDstVal;
    if (pIVar1->m_opcode == InlineArrayPush) {
      local_40 = uVar6;
      bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,&local_4c,false);
      bVar4 = ValueType::IsLikelyInt(&src2Val->valueInfo->super_ValueType);
      if ((bVar3 && local_4c == -0x7fffe) || (!bVar4)) goto LAB_0045fde8;
      ToTypeSpecUse(this,*pInstr,(*pInstr)->m_src2,this->currentBlock,src2Val,(IndirOpnd *)0x0,
                    TyInt32,BailOutIntOnly,false,(Instr *)0x0);
      uVar6 = local_40;
    }
    else {
      ToTypeSpecUse(this,pIVar1,pIVar1->m_src1,this->currentBlock,local_38,(IndirOpnd *)0x0,TyInt32,
                    BailOutIntOnly,false,(Instr *)0x0);
      ToTypeSpecUse(this,*pInstr,(*pInstr)->m_src2,this->currentBlock,src2Val,(IndirOpnd *)0x0,
                    TyInt32,BailOutIntOnly,false,(Instr *)0x0);
    }
    bVar3 = true;
    if ((!skipDst) && (pIVar1 = *pInstr, pIVar1->m_dst != (Opnd *)0x0)) {
      TypeSpecializeIntDst
                (this,pIVar1,pIVar1->m_opcode,(Value *)0x0,local_38,src2Val,BailOutInvalid,
                 (int32)uVar6,max,ppVStack_48,(AddSubConstantInfo *)0x0);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f75,"(false)","Yet to move code for other binary functions here");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
LAB_0045fde8:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntBinary(IR::Instr **pInstr, Value *src1Val, Value *src2Val, Value **pDstVal, int32 min, int32 max, bool skipDst /* = false */)
{
    // Consider moving the code for int type spec-ing binary functions here.
    IR::Instr *&instr = *pInstr;
    bool lossy = false;

    if(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        if(instr->m_opcode == Js::OpCode::InlineArrayPush)
        {
            int32 intConstantValue;
            bool isIntConstMissingItem = src2Val->GetValueInfo()->TryGetIntConstantValue(&intConstantValue);

            if(isIntConstMissingItem)
            {
                isIntConstMissingItem = Js::SparseArraySegment<int>::IsMissingItem(&intConstantValue);
            }

            // Don't specialize if the element is not likelyInt or an IntConst which is a missing item value.
            if(!(src2Val->GetValueInfo()->IsLikelyInt()) || isIntConstMissingItem)
            {
                return false;
            }
            // We don't want to specialize both the source operands, though it is a binary instr.
            IR::Opnd * elementOpnd = instr->GetSrc2();
            this->ToInt32(instr, elementOpnd, this->currentBlock, src2Val, nullptr, lossy);
        }
        else
        {
            IR::Opnd *src1 = instr->GetSrc1();
            this->ToInt32(instr, src1, this->currentBlock, src1Val, nullptr, lossy);

            IR::Opnd *src2 = instr->GetSrc2();
            this->ToInt32(instr, src2, this->currentBlock, src2Val, nullptr, lossy);
        }

        if(!skipDst)
        {
            IR::Opnd *dst = instr->GetDst();
            if (dst)
            {
                TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, src2Val, IR::BailOutInvalid, min, max, pDstVal);
            }
        }
        return true;
    }
    else
    {
        AssertMsg(false, "Yet to move code for other binary functions here");
        return false;
    }
}